

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  StrPair *this_00;
  byte bVar1;
  XMLDocument *pXVar2;
  MemPool *pMVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  byte *p_00;
  XMLAttribute *this_01;
  char *pcVar7;
  XMLAttribute *pXVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLAttribute *local_48;
  
  this_00 = &(this->super_XMLNode)._value;
  local_48 = (XMLAttribute *)0x0;
  do {
    if (p == (char *)0x0) {
      return (char *)0x0;
    }
    p_00 = (byte *)XMLUtil::SkipWhiteSpace(p,curLineNumPtr);
    bVar1 = *p_00;
    if (bVar1 == 0) {
      pXVar2 = (this->super_XMLNode)._document;
      iVar5 = (this->super_XMLNode)._parseLineNum;
      iVar6 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
      if (CONCAT44(extraout_var_00,iVar6) == 0) {
        pcVar7 = StrPair::GetStr(this_00);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      XMLDocument::SetError(pXVar2,XML_ERROR_PARSING_ELEMENT,iVar5,"XMLElement name=%s",pcVar7);
      return (char *)0x0;
    }
    if ((-1 < (char)bVar1) && (iVar5 = isalpha((uint)bVar1), iVar5 == 0)) {
      if (bVar1 < 0x3e) {
        if (bVar1 != 0x3a) {
          if ((bVar1 == 0x2f) && (p_00[1] == 0x3e)) {
            this->_closingType = CLOSED;
            return (char *)(p_00 + 2);
          }
LAB_0011a375:
          XMLDocument::SetError
                    ((this->super_XMLNode)._document,XML_ERROR_PARSING_ELEMENT,
                     (this->super_XMLNode)._parseLineNum,(char *)0x0);
          return (char *)0x0;
        }
      }
      else if (bVar1 != 0x5f) {
        if (bVar1 == 0x3e) {
          return (char *)(p_00 + 1);
        }
        goto LAB_0011a375;
      }
    }
    this_01 = (XMLAttribute *)
              MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
    this_01->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00127bf8;
    (this_01->_name)._flags = 0;
    (this_01->_name)._start = (char *)0x0;
    (this_01->_name)._end = (char *)0x0;
    (this_01->_value)._flags = 0;
    (this_01->_value)._start = (char *)0x0;
    (this_01->_value)._end = (char *)0x0;
    this_01->_parseLineNum = 0;
    this_01->_next = (XMLAttribute *)0x0;
    this_01->_memPool = (MemPool *)0x0;
    pXVar2 = (this->super_XMLNode)._document;
    this_01->_memPool = &(pXVar2->_attributePool).super_MemPool;
    (*(pXVar2->_attributePool).super_MemPool._vptr_MemPool[5])();
    pXVar2 = (this->super_XMLNode)._document;
    iVar5 = pXVar2->_parseCurLineNum;
    this_01->_parseLineNum = iVar5;
    p = XMLAttribute::ParseDeep(this_01,(char *)p_00,pXVar2->_processEntities,curLineNumPtr);
    if (p == (char *)0x0) {
LAB_0011a273:
      pMVar3 = this_01->_memPool;
      (**this_01->_vptr_XMLAttribute)(this_01);
      (*pMVar3->_vptr_MemPool[4])(pMVar3,this_01);
      pXVar2 = (this->super_XMLNode)._document;
      iVar6 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
      if (CONCAT44(extraout_var,iVar6) == 0) {
        pcVar7 = StrPair::GetStr(this_00);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      bVar4 = false;
      XMLDocument::SetError(pXVar2,XML_ERROR_PARSING_ATTRIBUTE,iVar5,"XMLElement name=%s",pcVar7);
    }
    else {
      pcVar7 = StrPair::GetStr(&this_01->_name);
      pXVar8 = FindAttribute(this,pcVar7);
      if ((pXVar8 != (XMLAttribute *)0x0) &&
         (pcVar7 = StrPair::GetStr(&pXVar8->_value), pcVar7 != (char *)0x0)) goto LAB_0011a273;
      if (local_48 == (XMLAttribute *)0x0) {
        this->_rootAttribute = this_01;
      }
      else {
        local_48->_next = this_01;
      }
      bVar4 = true;
      local_48 = this_01;
    }
    if (!bVar4) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, "XMLElement name=%s", Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( (unsigned char) *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            const int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, attrLineNum, "XMLElement name=%s", Name() );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, 0 );
            return 0;
        }
    }
    return p;
}